

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kiss_fft.c
# Opt level: O0

void kf_work(kiss_fft_cpx *Fout,kiss_fft_cpx *f,size_t fstride,int in_stride,int *factors,
            kiss_fft_cfg st)

{
  int iVar1;
  int m_00;
  int *piVar2;
  float fVar3;
  int in_ECX;
  kiss_fft_cpx *in_RDX;
  kiss_fft_cpx *in_RSI;
  kiss_fft_cfg in_RDI;
  int *in_R8;
  kiss_fft_cfg in_R9;
  kiss_fft_cpx *Fout_end;
  int m;
  int p;
  kiss_fft_cpx *Fout_beg;
  int *piVar4;
  int m_01;
  undefined4 in_stack_ffffffffffffffe0;
  kiss_fft_cfg local_8;
  
  iVar1 = *in_R8;
  piVar4 = in_R8 + 2;
  m_00 = in_R8[1];
  piVar2 = in_RDI->factors;
  local_8 = in_RDI;
  if (m_00 == 1) {
    do {
      fVar3 = in_RSI->i;
      local_8->nfft = (int)in_RSI->r;
      local_8->inverse = (int)fVar3;
      in_RSI = in_RSI + (long)in_RDX * (long)in_ECX;
      local_8 = (kiss_fft_cfg)local_8->factors;
    } while (local_8 != (kiss_fft_cfg)(piVar2 + (long)(iVar1 * m_00) * 2 + -2));
  }
  else {
    do {
      kf_work(in_RSI,in_RDX,CONCAT44(in_ECX,in_stack_ffffffffffffffe0),(int)((ulong)piVar4 >> 0x20),
              &in_R9->nfft,in_RDI);
      in_RSI = in_RSI + (long)in_RDX * (long)in_ECX;
      local_8 = (kiss_fft_cfg)(local_8->factors + (long)m_00 * 2 + -2);
    } while (local_8 != (kiss_fft_cfg)(piVar2 + (long)(iVar1 * m_00) * 2 + -2));
  }
  m_01 = (int)((ulong)piVar4 >> 0x20);
  switch(iVar1) {
  case 2:
    kf_bfly2((kiss_fft_cpx *)in_RDI,(size_t)in_RDX,in_R9,m_00);
    break;
  case 3:
    kf_bfly3((kiss_fft_cpx *)in_RDI,(size_t)in_RDX,in_R9,(long)m_00);
    break;
  case 4:
    kf_bfly4((kiss_fft_cpx *)in_RDI,(size_t)in_RDX,in_R9,(long)m_00);
    break;
  case 5:
    kf_bfly5(in_RSI,(size_t)in_RDX,(kiss_fft_cfg)CONCAT44(in_ECX,in_stack_ffffffffffffffe0),m_01);
    break;
  default:
    kf_bfly_generic(in_RSI,(size_t)in_RDX,(kiss_fft_cfg)CONCAT44(in_ECX,in_stack_ffffffffffffffe0),
                    m_01,(int)piVar4);
  }
  return;
}

Assistant:

static
void kf_work(
        kiss_fft_cpx * Fout,
        const kiss_fft_cpx * f,
        const size_t fstride,
        int in_stride,
        int * factors,
        const kiss_fft_cfg st
        )
{
    kiss_fft_cpx * Fout_beg=Fout;
    const int p=*factors++; /* the radix  */
    const int m=*factors++; /* stage's fft length/p */
    const kiss_fft_cpx * Fout_end = Fout + p*m;

#ifdef _OPENMP
    // use openmp extensions at the 
    // top-level (not recursive)
    if (fstride==1 && p<=5)
    {
        int k;

        // execute the p different work units in different threads
#       pragma omp parallel for
        for (k=0;k<p;++k) 
            kf_work( Fout +k*m, f+ fstride*in_stride*k,fstride*p,in_stride,factors,st);
        // all threads have joined by this point

        switch (p) {
            case 2: kf_bfly2(Fout,fstride,st,m); break;
            case 3: kf_bfly3(Fout,fstride,st,m); break; 
            case 4: kf_bfly4(Fout,fstride,st,m); break;
            case 5: kf_bfly5(Fout,fstride,st,m); break; 
            default: kf_bfly_generic(Fout,fstride,st,m,p); break;
        }
        return;
    }
#endif

    if (m==1) {
        do{
            *Fout = *f;
            f += fstride*in_stride;
        }while(++Fout != Fout_end );
    }else{
        do{
            // recursive call:
            // DFT of size m*p performed by doing
            // p instances of smaller DFTs of size m, 
            // each one takes a decimated version of the input
            kf_work( Fout , f, fstride*p, in_stride, factors,st);
            f += fstride*in_stride;
        }while( (Fout += m) != Fout_end );
    }

    Fout=Fout_beg;

    // recombine the p smaller DFTs 
    switch (p) {
        case 2: kf_bfly2(Fout,fstride,st,m); break;
        case 3: kf_bfly3(Fout,fstride,st,m); break; 
        case 4: kf_bfly4(Fout,fstride,st,m); break;
        case 5: kf_bfly5(Fout,fstride,st,m); break; 
        default: kf_bfly_generic(Fout,fstride,st,m,p); break;
    }
}